

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_symlink_utf8(archive_entry *entry)

{
  wchar_t wVar1;
  int *piVar2;
  archive_entry *local_20;
  char *p;
  archive_entry *entry_local;
  
  if ((entry->ae_set & 2U) == 0) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    p = (char *)entry;
    wVar1 = archive_mstring_get_utf8(entry->archive,&entry->ae_symlink,(char **)&local_20);
    if (wVar1 == L'\0') {
      entry_local = local_20;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        __archive_errx(1,"No memory");
      }
      entry_local = (archive_entry *)0x0;
    }
  }
  return (char *)entry_local;
}

Assistant:

const char *
archive_entry_symlink_utf8(struct archive_entry *entry)
{
	const char *p;
	if ((entry->ae_set & AE_SET_SYMLINK) == 0)
		return (NULL);
	if (archive_mstring_get_utf8(
	    entry->archive, &entry->ae_symlink, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}